

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O1

void __thiscall clog::Logger::~Logger(Logger *this)

{
  _Head_base<0UL,_clog::Logger::Impl_*,_false> _Var1;
  pointer *__ptr;
  LogStream *logline;
  
  Impl::finish((this->_pImpl)._M_t.
               super___uniq_ptr_impl<clog::Logger::Impl,_std::default_delete<clog::Logger::Impl>_>.
               _M_t.
               super__Tuple_impl<0UL,_clog::Logger::Impl_*,_std::default_delete<clog::Logger::Impl>_>
               .super__Head_base<0UL,_clog::Logger::Impl_*,_false>._M_head_impl);
  _Var1._M_head_impl =
       (this->_pImpl)._M_t.
       super___uniq_ptr_impl<clog::Logger::Impl,_std::default_delete<clog::Logger::Impl>_>._M_t.
       super__Tuple_impl<0UL,_clog::Logger::Impl_*,_std::default_delete<clog::Logger::Impl>_>.
       super__Head_base<0UL,_clog::Logger::Impl_*,_false>._M_head_impl;
  logline = &(_Var1._M_head_impl)->_stream;
  AsyncLogger::append((AsyncLogger *)logger,(char *)logline,
                      (long)*(char **)((long)&(_Var1._M_head_impl)->_stream + 0x1000) -
                      (long)logline);
  _Var1._M_head_impl =
       (this->_pImpl)._M_t.
       super___uniq_ptr_impl<clog::Logger::Impl,_std::default_delete<clog::Logger::Impl>_>._M_t.
       super__Tuple_impl<0UL,_clog::Logger::Impl_*,_std::default_delete<clog::Logger::Impl>_>.
       super__Head_base<0UL,_clog::Logger::Impl_*,_false>._M_head_impl;
  if ((_Var1._M_head_impl)->_level != 5) {
    operator_delete(_Var1._M_head_impl,0x1030);
    (this->_pImpl)._M_t.
    super___uniq_ptr_impl<clog::Logger::Impl,_std::default_delete<clog::Logger::Impl>_>._M_t.
    super__Tuple_impl<0UL,_clog::Logger::Impl_*,_std::default_delete<clog::Logger::Impl>_>.
    super__Head_base<0UL,_clog::Logger::Impl_*,_false>._M_head_impl = (Impl *)0x0;
    return;
  }
  abort();
}

Assistant:

Logger::~Logger()
{
    _pImpl->finish();
    const detail::FixBuffer<detail::kSmallBuffer>& buffer(_pImpl->_stream.buffer());
    
    logger.append(buffer.data(), buffer.size());

    if (_pImpl->_level == FATAL)
    {
        abort();
    }
}